

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockContextProcessUndockWindow
               (ImGuiContext_conflict *ctx,ImGuiWindow_conflict *window,
               _Bool clear_persistent_docking_ref)

{
  ImVec2 IVar1;
  ImGuiID local_3c;
  _Bool clear_persistent_docking_ref_local;
  ImGuiWindow_conflict *window_local;
  ImGuiContext_conflict *ctx_local;
  
  if (window->DockNode == (ImGuiDockNode *)0x0) {
    window->DockId = 0;
  }
  else {
    if (clear_persistent_docking_ref) {
      local_3c = 0;
    }
    else {
      local_3c = window->DockId;
    }
    DockNodeRemoveWindow(window->DockNode,window,local_3c);
  }
  window->Collapsed = false;
  window->field_0x3e1 = window->field_0x3e1 & 0xfe;
  window->field_0x3e1 = window->field_0x3e1 & 0xfb;
  window->field_0x3e1 = window->field_0x3e1 & 0xfd;
  IVar1 = FixLargeWindowsWhenUndocking(&window->SizeFull,&window->Viewport->super_ImGuiViewport);
  window->SizeFull = IVar1;
  window->Size = window->SizeFull;
  MarkIniSettingsDirty();
  return;
}

Assistant:

void ImGui::DockContextProcessUndockWindow(ImGuiContext* ctx, ImGuiWindow* window, bool clear_persistent_docking_ref)
{
    IMGUI_DEBUG_LOG_DOCKING("DockContextProcessUndockWindow window '%s', clear_persistent_docking_ref = %d\n", window->Name, clear_persistent_docking_ref);
    IM_UNUSED(ctx);
    if (window->DockNode)
        DockNodeRemoveWindow(window->DockNode, window, clear_persistent_docking_ref ? 0 : window->DockId);
    else
        window->DockId = 0;
    window->Collapsed = false;
    window->DockIsActive = false;
    window->DockNodeIsVisible = window->DockTabIsVisible = false;
    window->Size = window->SizeFull = FixLargeWindowsWhenUndocking(window->SizeFull, window->Viewport);

    MarkIniSettingsDirty();
}